

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueTest.hpp
# Opt level: O0

void Qentem::Test::TestAddition5(QTest *test)

{
  bool bVar1;
  Value<char> *pVVar2;
  String<char> *pSVar3;
  char *pcVar4;
  ArrayT *pAVar5;
  Array<Qentem::Value<char>_> *pAVar6;
  char *local_238;
  double local_230;
  double local_228;
  char *local_220;
  Value<char> *local_218;
  uint local_210;
  SizeT local_20c;
  String<char> local_208;
  Value<char> local_1f8;
  Value<char> local_1e0;
  Value<char> local_1c8;
  char *local_1b0;
  Value<char> *local_1a8;
  uint local_1a0;
  SizeT local_19c;
  String<char> local_198;
  Value<char> local_188;
  Value<char> local_170;
  Value<char> local_158;
  uint local_140;
  SizeT local_13c;
  Array<Qentem::Value<char>_> local_138;
  uint local_128;
  SizeT local_124;
  Array<Qentem::Value<char>_> local_120;
  char *local_110;
  char *local_108;
  uint local_100;
  SizeT local_fc;
  char *local_f8;
  char *c_str2;
  char *local_e0;
  uint local_d8;
  SizeT local_d4;
  char *local_d0;
  char *c_str;
  uint local_b8;
  SizeT local_b4;
  uint local_b0;
  SizeT local_ac;
  uint local_a8;
  SizeT local_a4;
  uint local_a0;
  SizeT local_9c;
  uint local_98;
  SizeT local_94;
  HArray<Qentem::String<char>,_Qentem::Value<char>_> local_90;
  Array<Qentem::Value<char>_> local_80;
  uint local_70;
  SizeT local_6c;
  undefined1 local_68 [8];
  VString str;
  ValueC *arr_storage;
  VArray arr_var;
  ValueC value2;
  ValueC value1;
  QTest *test_local;
  
  Value<char>::Value((Value<char> *)&value2.type_);
  Value<char>::Value((Value<char> *)&arr_var.index_);
  Array<Qentem::Value<char>_>::Array((Array<Qentem::Value<char>_> *)&arr_storage);
  String<char>::String((String<char> *)local_68);
  Value<char>::operator=((Value<char> *)&arr_var.index_,true);
  bVar1 = Value<char>::IsTrue((Value<char> *)&arr_var.index_);
  QTest::IsTrue(test,bVar1,0xf84);
  pVVar2 = Memory::Move<Qentem::Value<char>>((Value<char> *)&arr_var.index_);
  Value<char>::operator+=((Value<char> *)&value2.type_,pVVar2);
  bVar1 = Value<char>::IsArray((Value<char> *)&value2.type_);
  QTest::IsTrue(test,bVar1,0xf88);
  local_6c = Value<char>::Size((Value<char> *)&value2.type_);
  local_70 = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_6c,&local_70,0xf89);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,0);
  bVar1 = Value<char>::IsTrue(pVVar2);
  QTest::IsTrue(test,bVar1,0xf8a);
  Value<char>::operator+=((Value<char> *)&arr_var.index_,true);
  Value<char>::operator+=((Value<char> *)&arr_var.index_,false);
  Value<char>::operator+=((Value<char> *)&arr_var.index_,(NullType)0x0);
  Value<char>::operator+=((Value<char> *)&arr_var.index_,"v");
  Value<char>::operator+=((Value<char> *)&arr_var.index_,4);
  Array<Qentem::Value<char>_>::Array(&local_80,1,false);
  Value<char>::operator+=((Value<char> *)&arr_var.index_,&local_80);
  Array<Qentem::Value<char>_>::~Array(&local_80);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::HashTable(&local_90,1);
  Value<char>::operator+=((Value<char> *)&arr_var.index_,&local_90);
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::~HArray(&local_90);
  Value<char>::operator=((Value<char> *)&arr_var.index_,true);
  pVVar2 = Memory::Move<Qentem::Value<char>>((Value<char> *)&arr_var.index_);
  Value<char>::operator+=((Value<char> *)&value2.type_,pVVar2);
  bVar1 = Value<char>::IsArray((Value<char> *)&value2.type_);
  QTest::IsTrue(test,bVar1,0xf96);
  local_94 = Value<char>::Size((Value<char> *)&value2.type_);
  local_98 = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_94,&local_98,0xf97);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,0);
  bVar1 = Value<char>::IsTrue(pVVar2);
  QTest::IsTrue(test,bVar1,0xf98);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,1);
  bVar1 = Value<char>::IsTrue(pVVar2);
  QTest::IsTrue(test,bVar1,0xf99);
  Value<char>::Reset((Value<char> *)&value2.type_);
  Value<char>::operator=((Value<char> *)&arr_var.index_,false);
  pVVar2 = Memory::Move<Qentem::Value<char>>((Value<char> *)&arr_var.index_);
  Value<char>::operator+=((Value<char> *)&value2.type_,pVVar2);
  bVar1 = Value<char>::IsArray((Value<char> *)&value2.type_);
  QTest::IsTrue(test,bVar1,0xfa1);
  local_9c = Value<char>::Size((Value<char> *)&value2.type_);
  local_a0 = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_9c,&local_a0,0xfa2);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,0);
  bVar1 = Value<char>::IsFalse(pVVar2);
  QTest::IsTrue(test,bVar1,0xfa3);
  Value<char>::operator=((Value<char> *)&arr_var.index_,false);
  pVVar2 = Memory::Move<Qentem::Value<char>>((Value<char> *)&arr_var.index_);
  Value<char>::operator+=((Value<char> *)&value2.type_,pVVar2);
  bVar1 = Value<char>::IsArray((Value<char> *)&value2.type_);
  QTest::IsTrue(test,bVar1,0xfa7);
  local_a4 = Value<char>::Size((Value<char> *)&value2.type_);
  local_a8 = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_a4,&local_a8,0xfa8);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,0);
  bVar1 = Value<char>::IsFalse(pVVar2);
  QTest::IsTrue(test,bVar1,0xfa9);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,1);
  bVar1 = Value<char>::IsFalse(pVVar2);
  QTest::IsTrue(test,bVar1,0xfaa);
  Value<char>::Reset((Value<char> *)&value2.type_);
  Value<char>::operator=((Value<char> *)&arr_var.index_,(NullType)0x0);
  pVVar2 = Memory::Move<Qentem::Value<char>>((Value<char> *)&arr_var.index_);
  Value<char>::operator+=((Value<char> *)&value2.type_,pVVar2);
  bVar1 = Value<char>::IsArray((Value<char> *)&value2.type_);
  QTest::IsTrue(test,bVar1,0xfb1);
  local_ac = Value<char>::Size((Value<char> *)&value2.type_);
  local_b0 = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_ac,&local_b0,0xfb2);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,0);
  bVar1 = Value<char>::IsNull(pVVar2);
  QTest::IsTrue(test,bVar1,0xfb3);
  Value<char>::operator=((Value<char> *)&arr_var.index_,(NullType)0x0);
  pVVar2 = Memory::Move<Qentem::Value<char>>((Value<char> *)&arr_var.index_);
  Value<char>::operator+=((Value<char> *)&value2.type_,pVVar2);
  bVar1 = Value<char>::IsArray((Value<char> *)&value2.type_);
  QTest::IsTrue(test,bVar1,0xfb7);
  local_b4 = Value<char>::Size((Value<char> *)&value2.type_);
  local_b8 = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_b4,&local_b8,0xfb8);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,0);
  bVar1 = Value<char>::IsNull(pVVar2);
  QTest::IsTrue(test,bVar1,0xfb9);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,1);
  bVar1 = Value<char>::IsNull(pVVar2);
  QTest::IsTrue(test,bVar1,0xfba);
  Value<char>::Reset((Value<char> *)&value2.type_);
  String<char>::String((String<char> *)&c_str,"-ABCDEF0123456789ABCDEF0123456789-");
  String<char>::operator=((String<char> *)local_68,(String<char> *)&c_str);
  String<char>::~String((String<char> *)&c_str);
  local_d0 = String<char>::First((String<char> *)local_68);
  pSVar3 = Memory::Move<Qentem::String<char>>((String<char> *)local_68);
  Value<char>::operator=((Value<char> *)&arr_var.index_,pSVar3);
  pVVar2 = Memory::Move<Qentem::Value<char>>((Value<char> *)&arr_var.index_);
  Value<char>::operator+=((Value<char> *)&value2.type_,pVVar2);
  bVar1 = Value<char>::IsArray((Value<char> *)&value2.type_);
  QTest::IsTrue(test,bVar1,0xfc3);
  local_d4 = Value<char>::Size((Value<char> *)&value2.type_);
  local_d8 = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_d4,&local_d8,0xfc4);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,0);
  bVar1 = Value<char>::IsString(pVVar2);
  QTest::IsTrue(test,bVar1,0xfc5);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,0);
  local_e0 = Value<char>::StringStorage(pVVar2);
  QTest::IsEqual<char_const*,char_const*>(test,&local_e0,&local_d0,0xfc6);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,0);
  pcVar4 = Value<char>::StringStorage(pVVar2);
  bVar1 = StringUtils::IsEqual<char>(pcVar4,"-ABCDEF0123456789ABCDEF0123456789-",0x22);
  QTest::IsTrue(test,bVar1,0xfc7);
  String<char>::String((String<char> *)&c_str2,"#0123456789ABCDEF0123456789ABCDEF#");
  String<char>::operator=((String<char> *)local_68,(String<char> *)&c_str2);
  String<char>::~String((String<char> *)&c_str2);
  local_f8 = String<char>::First((String<char> *)local_68);
  pSVar3 = Memory::Move<Qentem::String<char>>((String<char> *)local_68);
  Value<char>::operator=((Value<char> *)&arr_var.index_,pSVar3);
  pVVar2 = Memory::Move<Qentem::Value<char>>((Value<char> *)&arr_var.index_);
  Value<char>::operator+=((Value<char> *)&value2.type_,pVVar2);
  bVar1 = Value<char>::IsArray((Value<char> *)&value2.type_);
  QTest::IsTrue(test,bVar1,0xfce);
  local_fc = Value<char>::Size((Value<char> *)&value2.type_);
  local_100 = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_fc,&local_100,0xfcf);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,0);
  bVar1 = Value<char>::IsString(pVVar2);
  QTest::IsTrue(test,bVar1,0xfd0);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,1);
  bVar1 = Value<char>::IsString(pVVar2);
  QTest::IsTrue(test,bVar1,0xfd1);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,0);
  local_108 = Value<char>::StringStorage(pVVar2);
  QTest::IsEqual<char_const*,char_const*>(test,&local_108,&local_d0,0xfd2);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,1);
  local_110 = Value<char>::StringStorage(pVVar2);
  QTest::IsEqual<char_const*,char_const*>(test,&local_110,&local_f8,0xfd3);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,0);
  pcVar4 = Value<char>::StringStorage(pVVar2);
  bVar1 = StringUtils::IsEqual<char>(pcVar4,"-ABCDEF0123456789ABCDEF0123456789-",0x22);
  QTest::IsTrue(test,bVar1,0xfd4);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,1);
  pcVar4 = Value<char>::StringStorage(pVVar2);
  bVar1 = StringUtils::IsEqual<char>(pcVar4,"#0123456789ABCDEF0123456789ABCDEF#",0x22);
  QTest::IsTrue(test,bVar1,0xfd5);
  Value<char>::Reset((Value<char> *)&value2.type_);
  Array<Qentem::Value<char>_>::Array(&local_120,1,false);
  Value<char>::operator=((Value<char> *)&arr_var.index_,&local_120);
  Array<Qentem::Value<char>_>::~Array(&local_120);
  Value<char>::Merge((Value<char> *)&value2.type_,(Value<char> *)&arr_var.index_);
  bVar1 = Value<char>::IsArray((Value<char> *)&value2.type_);
  QTest::IsTrue(test,bVar1,0xfdb);
  local_124 = Value<char>::Size((Value<char> *)&value2.type_);
  local_128 = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_124,&local_128,0xfdc);
  pAVar5 = Value<char>::GetArray((Value<char> *)&value2.type_);
  QTest::IsNotNull(test,pAVar5,0xfdd);
  pAVar5 = Value<char>::GetArray((Value<char> *)&arr_var.index_);
  QTest::IsNotNull(test,pAVar5,0xfde);
  Array<Qentem::Value<char>_>::Array(&local_138,1,false);
  Value<char>::operator=((Value<char> *)&arr_var.index_,&local_138);
  Array<Qentem::Value<char>_>::~Array(&local_138);
  pVVar2 = Memory::Move<Qentem::Value<char>>((Value<char> *)&arr_var.index_);
  Value<char>::Merge((Value<char> *)&value2.type_,pVVar2);
  bVar1 = Value<char>::IsArray((Value<char> *)&value2.type_);
  QTest::IsTrue(test,bVar1,0xfe2);
  local_13c = Value<char>::Size((Value<char> *)&value2.type_);
  local_140 = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_13c,&local_140,0xfe3);
  pAVar5 = Value<char>::GetArray((Value<char> *)&value2.type_);
  QTest::IsNotNull(test,pAVar5,0xfe4);
  pAVar5 = Value<char>::GetArray((Value<char> *)&arr_var.index_);
  QTest::IsNull(test,pAVar5,0xfe5);
  Value<char>::Reset((Value<char> *)&value2.type_);
  Value<char>::Value(&local_158,False);
  Array<Qentem::Value<char>_>::operator+=((Array<Qentem::Value<char>_> *)&arr_storage,&local_158);
  Value<char>::~Value(&local_158);
  Value<char>::Value(&local_170,True);
  Array<Qentem::Value<char>_>::operator+=((Array<Qentem::Value<char>_> *)&arr_storage,&local_170);
  Value<char>::~Value(&local_170);
  String<char>::String(&local_198,"-ABCDEF0123456789ABCDEF0123456789-");
  Value<char>::Value(&local_188,&local_198);
  Array<Qentem::Value<char>_>::operator+=((Array<Qentem::Value<char>_> *)&arr_storage,&local_188);
  Value<char>::~Value(&local_188);
  String<char>::~String(&local_198);
  str._8_8_ = Array<Qentem::Value<char>_>::First((Array<Qentem::Value<char>_> *)&arr_storage);
  local_d0 = Value<char>::StringStorage((Value<char> *)(str._8_8_ + 0x30));
  pAVar6 = Memory::Move<Qentem::Array<Qentem::Value<char>>>
                     ((Array<Qentem::Value<char>_> *)&arr_storage);
  Value<char>::operator=((Value<char> *)&arr_var.index_,pAVar6);
  pVVar2 = Memory::Move<Qentem::Value<char>>((Value<char> *)&arr_var.index_);
  Value<char>::Merge((Value<char> *)&value2.type_,pVVar2);
  bVar1 = Value<char>::IsArray((Value<char> *)&value2.type_);
  QTest::IsTrue(test,bVar1,0xff2);
  local_19c = Value<char>::Size((Value<char> *)&value2.type_);
  local_1a0 = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_19c,&local_1a0,0xff3);
  pAVar5 = Value<char>::GetArray((Value<char> *)&value2.type_);
  QTest::IsNotNull(test,pAVar5,0xff4);
  pAVar5 = Value<char>::GetArray((Value<char> *)&value2.type_);
  pVVar2 = Array<Qentem::Value<char>_>::First(pAVar5);
  QTest::IsNotNull(test,pVVar2,0xff5);
  pAVar5 = Value<char>::GetArray((Value<char> *)&value2.type_);
  local_1a8 = Array<Qentem::Value<char>_>::First(pAVar5);
  QTest::IsNotEqual<Qentem::Value<char>const*,Qentem::Value<char>const*>
            (test,&local_1a8,(Value<char> **)&str.length_,0xff6);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,0);
  bVar1 = Value<char>::IsFalse(pVVar2);
  QTest::IsTrue(test,bVar1,0xff7);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,1);
  bVar1 = Value<char>::IsTrue(pVVar2);
  QTest::IsTrue(test,bVar1,0xff8);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,2);
  bVar1 = Value<char>::IsString(pVVar2);
  QTest::IsTrue(test,bVar1,0xff9);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,2);
  local_1b0 = Value<char>::StringStorage(pVVar2);
  QTest::IsEqual<char_const*,char_const*>(test,&local_1b0,&local_d0,0xffa);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,2);
  pcVar4 = Value<char>::StringStorage(pVVar2);
  bVar1 = StringUtils::IsEqual<char>(pcVar4,"-ABCDEF0123456789ABCDEF0123456789-",0x22);
  QTest::IsTrue(test,bVar1,0xffb);
  Array<Qentem::Value<char>_>::Reset((Array<Qentem::Value<char>_> *)&arr_storage);
  Value<char>::Value(&local_1c8,Null);
  Array<Qentem::Value<char>_>::operator+=((Array<Qentem::Value<char>_> *)&arr_storage,&local_1c8);
  Value<char>::~Value(&local_1c8);
  Value<char>::Value<int>(&local_1e0,0xe);
  Array<Qentem::Value<char>_>::operator+=((Array<Qentem::Value<char>_> *)&arr_storage,&local_1e0);
  Value<char>::~Value(&local_1e0);
  String<char>::String(&local_208,"#0123456789ABCDEF0123456789ABCDEF#");
  Value<char>::Value(&local_1f8,&local_208);
  Array<Qentem::Value<char>_>::operator+=((Array<Qentem::Value<char>_> *)&arr_storage,&local_1f8);
  Value<char>::~Value(&local_1f8);
  String<char>::~String(&local_208);
  str._8_8_ = Array<Qentem::Value<char>_>::First((Array<Qentem::Value<char>_> *)&arr_storage);
  local_f8 = Value<char>::StringStorage((Value<char> *)(str._8_8_ + 0x30));
  pAVar6 = Memory::Move<Qentem::Array<Qentem::Value<char>>>
                     ((Array<Qentem::Value<char>_> *)&arr_storage);
  Value<char>::operator=((Value<char> *)&arr_var.index_,pAVar6);
  pVVar2 = Memory::Move<Qentem::Value<char>>((Value<char> *)&arr_var.index_);
  Value<char>::Merge((Value<char> *)&value2.type_,pVVar2);
  bVar1 = Value<char>::IsUndefined((Value<char> *)&arr_var.index_);
  QTest::IsTrue(test,bVar1,0x1006);
  bVar1 = Value<char>::IsArray((Value<char> *)&value2.type_);
  QTest::IsTrue(test,bVar1,0x1007);
  local_20c = Value<char>::Size((Value<char> *)&value2.type_);
  local_210 = 6;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,&local_20c,&local_210,0x1008);
  pAVar5 = Value<char>::GetArray((Value<char> *)&value2.type_);
  QTest::IsNotNull(test,pAVar5,0x1009);
  pAVar5 = Value<char>::GetArray((Value<char> *)&value2.type_);
  pVVar2 = Array<Qentem::Value<char>_>::First(pAVar5);
  QTest::IsNotNull(test,pVVar2,0x100a);
  pAVar5 = Value<char>::GetArray((Value<char> *)&value2.type_);
  local_218 = Array<Qentem::Value<char>_>::First(pAVar5);
  QTest::IsNotEqual<Qentem::Value<char>const*,Qentem::Value<char>const*>
            (test,&local_218,(Value<char> **)&str.length_,0x100b);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,0);
  bVar1 = Value<char>::IsFalse(pVVar2);
  QTest::IsTrue(test,bVar1,0x100c);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,1);
  bVar1 = Value<char>::IsTrue(pVVar2);
  QTest::IsTrue(test,bVar1,0x100d);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,2);
  bVar1 = Value<char>::IsString(pVVar2);
  QTest::IsTrue(test,bVar1,0x100e);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,2);
  local_220 = Value<char>::StringStorage(pVVar2);
  QTest::IsEqual<char_const*,char_const*>(test,&local_220,&local_d0,0x100f);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,2);
  pcVar4 = Value<char>::StringStorage(pVVar2);
  bVar1 = StringUtils::IsEqual<char>(pcVar4,"-ABCDEF0123456789ABCDEF0123456789-",0x22);
  QTest::IsTrue(test,bVar1,0x1010);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,3);
  bVar1 = Value<char>::IsNull(pVVar2);
  QTest::IsTrue(test,bVar1,0x1011);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,4);
  bVar1 = Value<char>::IsNumber(pVVar2);
  QTest::IsTrue(test,bVar1,0x1012);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,4);
  local_228 = Value<char>::GetNumber(pVVar2);
  local_230 = 14.0;
  QTest::IsEqual<double,double>(test,&local_228,&local_230,0x1013);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,5);
  bVar1 = Value<char>::IsString(pVVar2);
  QTest::IsTrue(test,bVar1,0x1014);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,5);
  local_238 = Value<char>::StringStorage(pVVar2);
  QTest::IsEqual<char_const*,char_const*>(test,&local_238,&local_f8,0x1015);
  pVVar2 = Value<char>::operator[]<int>((Value<char> *)&value2.type_,5);
  pcVar4 = Value<char>::StringStorage(pVVar2);
  bVar1 = StringUtils::IsEqual<char>(pcVar4,"#0123456789ABCDEF0123456789ABCDEF#",0x22);
  QTest::IsTrue(test,bVar1,0x1016);
  Value<char>::Reset((Value<char> *)&value2.type_);
  String<char>::~String((String<char> *)local_68);
  Array<Qentem::Value<char>_>::~Array((Array<Qentem::Value<char>_> *)&arr_storage);
  Value<char>::~Value((Value<char> *)&arr_var.index_);
  Value<char>::~Value((Value<char> *)&value2.type_);
  return;
}

Assistant:

static void TestAddition5(QTest &test) {
    ValueC        value1;
    ValueC        value2;
    VArray        arr_var;
    const ValueC *arr_storage;
    VString       str;

    /////////////////

    value2 = true;
    test.IsTrue(value2.IsTrue(), __LINE__);

    value1 += Memory::Move(value2);

    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 1U, __LINE__);
    test.IsTrue(value1[0].IsTrue(), __LINE__);

    value2 += true;
    value2 += false;
    value2 += nullptr;
    value2 += "v";
    value2 += 4;
    value2 += VArray(1);
    value2 += VHArray(1);

    value2 = true;
    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 2U, __LINE__);
    test.IsTrue(value1[0].IsTrue(), __LINE__);
    test.IsTrue(value1[1].IsTrue(), __LINE__);

    value1.Reset();
    /////////////////

    value2 = false;

    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 1U, __LINE__);
    test.IsTrue(value1[0].IsFalse(), __LINE__);

    value2 = false;
    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 2U, __LINE__);
    test.IsTrue(value1[0].IsFalse(), __LINE__);
    test.IsTrue(value1[1].IsFalse(), __LINE__);

    value1.Reset();
    /////////////////

    value2 = nullptr;
    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 1U, __LINE__);
    test.IsTrue(value1[0].IsNull(), __LINE__);

    value2 = nullptr;
    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 2U, __LINE__);
    test.IsTrue(value1[0].IsNull(), __LINE__);
    test.IsTrue(value1[1].IsNull(), __LINE__);

    value1.Reset();
    /////////////////
    str               = VString("-ABCDEF0123456789ABCDEF0123456789-");
    const char *c_str = str.First();
    value2            = Memory::Move(str);

    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 1U, __LINE__);
    test.IsTrue(value1[0].IsString(), __LINE__);
    test.IsEqual(value1[0].StringStorage(), c_str, __LINE__);
    test.IsTrue(StringUtils::IsEqual(value1[0].StringStorage(), "-ABCDEF0123456789ABCDEF0123456789-", 34), __LINE__);

    str                = VString("#0123456789ABCDEF0123456789ABCDEF#");
    const char *c_str2 = str.First();
    value2             = Memory::Move(str);

    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 2U, __LINE__);
    test.IsTrue(value1[0].IsString(), __LINE__);
    test.IsTrue(value1[1].IsString(), __LINE__);
    test.IsEqual(value1[0].StringStorage(), c_str, __LINE__);
    test.IsEqual(value1[1].StringStorage(), c_str2, __LINE__);
    test.IsTrue(StringUtils::IsEqual(value1[0].StringStorage(), "-ABCDEF0123456789ABCDEF0123456789-", 34), __LINE__);
    test.IsTrue(StringUtils::IsEqual(value1[1].StringStorage(), "#0123456789ABCDEF0123456789ABCDEF#", 34), __LINE__);
    value1.Reset();
    /////////////////

    value2 = VArray(1);
    value1.Merge(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 0U, __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNotNull(value2.GetArray(), __LINE__);

    value2 = VArray(1);
    value1.Merge(Memory::Move(value2));
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 0U, __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNull(value2.GetArray(), __LINE__);

    value1.Reset();
    ///

    arr_var += ValueC{ValueType::False};
    arr_var += ValueC{ValueType::True};
    arr_var += ValueC{VString("-ABCDEF0123456789ABCDEF0123456789-")};
    arr_storage = arr_var.First();
    c_str       = arr_storage[2].StringStorage();
    value2      = Memory::Move(arr_var);

    value1.Merge(Memory::Move(value2));
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 3U, __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNotNull(value1.GetArray()->First(), __LINE__);
    test.IsNotEqual(value1.GetArray()->First(), arr_storage, __LINE__);
    test.IsTrue(value1[0].IsFalse(), __LINE__);
    test.IsTrue(value1[1].IsTrue(), __LINE__);
    test.IsTrue(value1[2].IsString(), __LINE__);
    test.IsEqual(value1[2].StringStorage(), c_str, __LINE__);
    test.IsTrue(StringUtils::IsEqual(value1[2].StringStorage(), "-ABCDEF0123456789ABCDEF0123456789-", 34), __LINE__);

    arr_var.Reset();
    arr_var += ValueC{ValueType::Null};
    arr_var += ValueC{14};
    arr_var += ValueC{VString("#0123456789ABCDEF0123456789ABCDEF#")};
    arr_storage = arr_var.First();
    c_str2      = arr_storage[2].StringStorage();
    value2      = Memory::Move(arr_var);

    value1.Merge(Memory::Move(value2));
    test.IsTrue(value2.IsUndefined(), __LINE__);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 6U, __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNotNull(value1.GetArray()->First(), __LINE__);
    test.IsNotEqual(value1.GetArray()->First(), arr_storage, __LINE__);
    test.IsTrue(value1[0].IsFalse(), __LINE__);
    test.IsTrue(value1[1].IsTrue(), __LINE__);
    test.IsTrue(value1[2].IsString(), __LINE__);
    test.IsEqual(value1[2].StringStorage(), c_str, __LINE__);
    test.IsTrue(StringUtils::IsEqual(value1[2].StringStorage(), "-ABCDEF0123456789ABCDEF0123456789-", 34), __LINE__);
    test.IsTrue(value1[3].IsNull(), __LINE__);
    test.IsTrue(value1[4].IsNumber(), __LINE__);
    test.IsEqual(value1[4].GetNumber(), 14.0, __LINE__);
    test.IsTrue(value1[5].IsString(), __LINE__);
    test.IsEqual(value1[5].StringStorage(), c_str2, __LINE__);
    test.IsTrue(StringUtils::IsEqual(value1[5].StringStorage(), "#0123456789ABCDEF0123456789ABCDEF#", 34), __LINE__);
    value1.Reset();
    //////////////////////////////////////////
}